

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSA.cpp
# Opt level: O0

void __thiscall Storage::Disk::MSA::MSA(MSA *this,string *file_name)

{
  bool bVar1;
  uint16_t uVar2;
  undefined4 *puVar3;
  long lVar4;
  size_type sVar5;
  size_t __nbytes;
  uint16_t local_66;
  uint8_t local_64;
  uint8_t local_63;
  ushort local_62;
  undefined1 local_60 [2];
  uint16_t count;
  uint8_t value;
  uint8_t byte;
  uint16_t pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> track;
  long start_of_track;
  undefined1 local_28 [8];
  uint16_t data_length;
  uint16_t signature;
  string *local_18;
  string *file_name_local;
  MSA *this_local;
  
  local_18 = file_name;
  file_name_local = (string *)this;
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__MSA_00caa510;
  FileHolder::FileHolder(&this->file_,local_18,ReadWrite);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&this->uncompressed_tracks_);
  local_28._2_2_ = FileHolder::get16be(&this->file_);
  if (local_28._2_2_ != 0xe0f) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0xfffffffe;
    __cxa_throw(puVar3,&Error::typeinfo,0);
  }
  uVar2 = FileHolder::get16be(&this->file_);
  this->sectors_per_track_ = uVar2;
  uVar2 = FileHolder::get16be(&this->file_);
  this->sides_ = uVar2 + 1;
  uVar2 = FileHolder::get16be(&this->file_);
  this->starting_track_ = uVar2;
  uVar2 = FileHolder::get16be(&this->file_);
  this->ending_track_ = uVar2;
  do {
    while( true ) {
      local_28._0_2_ = FileHolder::get16be(&this->file_);
      bVar1 = FileHolder::eof(&this->file_);
      if (bVar1) {
        sVar5 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::size(&this->uncompressed_tracks_);
        if (sVar5 == (long)(int)((((uint)this->ending_track_ - (uint)this->starting_track_) + 1) *
                                (uint)this->sides_)) {
          return;
        }
        puVar3 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar3 = 0xfffffffe;
        __cxa_throw(puVar3,&Error::typeinfo,0);
      }
      __nbytes = (ulong)this->sectors_per_track_ << 9;
      if ((uint)(ushort)local_28._0_2_ != (uint)__nbytes) break;
      FileHolder::read((FileHolder *)&start_of_track,(int)this + 8,
                       (void *)(ulong)(ushort)local_28._0_2_,__nbytes);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back(&this->uncompressed_tracks_,(value_type *)&start_of_track);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&start_of_track);
    }
    track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)FileHolder::tell(&this->file_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
               (ulong)this->sectors_per_track_ << 9);
    local_62 = 0;
    while (local_62 < (ushort)local_28._0_2_) {
      local_63 = FileHolder::get8(&this->file_);
      if (local_63 == 0xe5) {
        local_62 = local_62 + 4;
        if ((ushort)local_28._0_2_ < local_62) break;
        local_64 = FileHolder::get8(&this->file_);
        local_66 = FileHolder::get16be(&this->file_);
        while (local_66 != 0) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,&local_64);
          local_66 = local_66 - 1;
        }
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,&local_63);
        local_62 = local_62 + 1;
      }
    }
    lVar4 = FileHolder::tell(&this->file_);
    if (lVar4 - (long)track.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage != (ulong)local_62) {
      __assert_fail("file_.tell() - start_of_track == pointer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/MSA.cpp"
                    ,0x41,"Storage::Disk::MSA::MSA(const std::string &)");
    }
    if ((local_62 != local_28._0_2_) ||
       (sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60),
       sVar5 != (long)(int)((uint)this->sectors_per_track_ << 9))) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xfffffffe;
      __cxa_throw(puVar3,&Error::typeinfo,0);
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(&this->uncompressed_tracks_,(value_type *)local_60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  } while( true );
}

Assistant:

MSA::MSA(const std::string &file_name) :
	file_(file_name) {
	const auto signature = file_.get16be();
	if(signature != 0x0e0f) throw Error::InvalidFormat;

	sectors_per_track_ = file_.get16be();
	sides_ = 1 + file_.get16be();
	starting_track_ = file_.get16be();
	ending_track_ = file_.get16be();

	// Create the uncompressed track list.
	while(true) {
		const auto data_length = file_.get16be();
		if(file_.eof()) break;

		if(data_length == sectors_per_track_ * 512) {
			// This is an uncompressed track.
			uncompressed_tracks_.push_back(file_.read(data_length));
		} else {
#ifndef NDEBUG
			const auto start_of_track = file_.tell();
#endif
			// This is an RLE-compressed track.
			std::vector<uint8_t> track;
			track.reserve(sectors_per_track_ * 512);
			uint16_t pointer = 0;
			while(pointer < data_length) {
				const auto byte = file_.get8();

				// Compression scheme: if the byte E5 is encountered, an RLE run follows.
				// An RLE run is encoded as the byte to repeat plus a 16-bit repeat count.
				if(byte != 0xe5) {
					track.push_back(byte);
					++pointer;
					continue;
				}

				pointer += 4;
				if(pointer > data_length) break;

				const auto value = file_.get8();
				auto count = file_.get16be();
				while(count--) {
					track.push_back(value);
				}
			}

#ifndef NDEBUG
			assert(file_.tell() - start_of_track == pointer);
#endif

			if(pointer != data_length || track.size() != sectors_per_track_ * 512)
				throw Error::InvalidFormat;
			uncompressed_tracks_.push_back(std::move(track));
		}
	}

	if(uncompressed_tracks_.size() != size_t((ending_track_ - starting_track_ + 1)*sides_))
		throw Error::InvalidFormat;
}